

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O2

PyObject * EventVecToDict::convert(vector<EventDataType,_std::allocator<EventDataType>_> *vec)

{
  list *this;
  ulong uVar1;
  long lVar2;
  dict d;
  proxy<boost::python::api::item_policies> local_60;
  string local_50;
  
  this = (list *)operator_new(8);
  boost::python::detail::list_base::list_base((list_base *)this);
  lVar2 = 0;
  for (uVar1 = 0;
      uVar1 < (ulong)(((long)(vec->super__Vector_base<EventDataType,_std::allocator<EventDataType>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(vec->super__Vector_base<EventDataType,_std::allocator<EventDataType>_>)
                            ._M_impl.super__Vector_impl_data._M_start) / 0x48); uVar1 = uVar1 + 1) {
    boost::python::detail::dict_base::dict_base(&d.super_dict_base);
    EventDataType::getName_abi_cxx11_
              (&local_50,
               (EventDataType *)
               ((long)&(((vec->super__Vector_base<EventDataType,_std::allocator<EventDataType>_>).
                         _M_impl.super__Vector_impl_data._M_start)->super_NetworkDataType).
                       _vptr_NetworkDataType + lVar2));
    boost::python::api::object_operators<boost::python::api::object>::operator[]<char[6]>
              ((object_operators<boost::python::api::object> *)&local_60,
               (char (*) [6])&d.super_dict_base);
    boost::python::api::proxy<boost::python::api::item_policies>::operator=(&local_60,&local_50);
    boost::python::api::proxy<boost::python::api::item_policies>::~proxy(&local_60);
    std::__cxx11::string::~string((string *)&local_50);
    EventDataType::getOrigin_abi_cxx11_
              (&local_50,
               (EventDataType *)
               ((long)&(((vec->super__Vector_base<EventDataType,_std::allocator<EventDataType>_>).
                         _M_impl.super__Vector_impl_data._M_start)->super_NetworkDataType).
                       _vptr_NetworkDataType + lVar2));
    boost::python::api::object_operators<boost::python::api::object>::operator[]<char[7]>
              ((object_operators<boost::python::api::object> *)&local_60,
               (char (*) [7])&d.super_dict_base);
    boost::python::api::proxy<boost::python::api::item_policies>::operator=(&local_60,&local_50);
    boost::python::api::proxy<boost::python::api::item_policies>::~proxy(&local_60);
    std::__cxx11::string::~string((string *)&local_50);
    boost::python::list::append<boost::python::dict>(this,(dict *)&d.super_dict_base);
    boost::python::api::object_base::~object_base((object_base *)&d.super_dict_base);
    lVar2 = lVar2 + 0x48;
  }
  return (this->super_list_base).super_object.super_object_base.m_ptr;
}

Assistant:

static PyObject* convert(const std::vector<EventDataType>& vec){
        list* l = new list();
        for(size_t i = 0; i < vec.size(); i++){
            dict d;
            d["event"] = vec[i].getName();
            d["origin"] = vec[i].getOrigin();
            l->append(d);
        }
        return l->ptr();
    }